

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.cpp
# Opt level: O0

void __thiscall RK8::Step(RK8 *this,double t,Mat *y,double h,Mat *u)

{
  code *pcVar1;
  double dVar2;
  Mat local_790;
  Mat local_780;
  Mat local_770;
  Mat local_760;
  Mat local_750;
  Mat local_740;
  Mat local_730;
  Mat local_720;
  Mat local_710;
  Mat local_700;
  Mat local_6f0;
  Mat local_6e0;
  Mat local_6d0;
  Mat local_6c0;
  Mat local_6b0;
  Mat local_6a0;
  Mat local_690;
  Mat local_680;
  Mat local_670;
  Mat local_660;
  Mat local_650;
  Mat local_640;
  Mat local_630;
  Mat local_620;
  Mat local_610;
  Mat local_600;
  Mat local_5f0;
  Mat local_5e0;
  Mat local_5d0;
  Mat local_5c0;
  Mat local_5b0;
  Mat local_5a0;
  Mat local_590;
  Mat local_580;
  Mat local_570;
  Mat local_560;
  Mat local_550;
  Mat local_540;
  Mat local_530;
  Mat local_520;
  Mat local_510;
  Mat local_500;
  Mat local_4f0;
  Mat local_4e0;
  Mat local_4d0;
  Mat local_4c0;
  Mat local_4b0;
  Mat local_4a0;
  Mat local_490;
  Mat local_480;
  Mat local_470;
  Mat local_460;
  Mat local_450;
  Mat local_440;
  Mat local_430;
  Mat local_420;
  Mat local_410;
  Mat local_400;
  Mat local_3f0;
  Mat local_3e0;
  Mat local_3d0;
  Mat local_3c0;
  Mat local_3b0;
  Mat local_3a0;
  Mat local_390;
  Mat local_380;
  Mat local_370;
  Mat local_360;
  Mat local_350;
  Mat local_340;
  Mat local_330;
  Mat local_320;
  Mat local_310;
  Mat local_300;
  Mat local_2f0;
  Mat local_2e0;
  Mat local_2d0;
  Mat local_2c0;
  Mat local_2b0;
  Mat local_2a0;
  Mat local_290;
  Mat local_280;
  Mat local_270;
  Mat local_260;
  Mat local_250;
  Mat local_240;
  Mat local_230;
  Mat local_220;
  Mat local_210;
  Mat local_200;
  Mat local_1f0;
  Mat local_1e0;
  Mat local_1d0;
  Mat local_1c0;
  Mat local_1b0;
  Mat local_1a0;
  Mat local_190;
  Mat local_180;
  Mat local_170;
  Mat local_160;
  Mat local_150;
  Mat local_140;
  Mat local_130;
  Mat local_120;
  Mat local_110;
  Mat local_100;
  Mat local_f0;
  Mat local_e0;
  Mat local_d0;
  Mat local_c0;
  Mat local_b0;
  Mat local_a0;
  Mat local_90;
  Mat local_80;
  Mat local_70 [2];
  Mat local_50;
  Mat local_40;
  Mat *local_30;
  Mat *u_local;
  double h_local;
  Mat *y_local;
  double t_local;
  RK8 *this_local;
  
  pcVar1 = *(code **)(this + 0x30);
  local_30 = u;
  u_local = (Mat *)h;
  h_local = (double)y;
  y_local = (Mat *)t;
  t_local = (double)this;
  Mat::Mat(&local_40,y);
  Mat::Mat(&local_50,u);
  (*pcVar1)(t,&local_40,this + 0x78,&local_50);
  Mat::~Mat(&local_50);
  Mat::~Mat(&local_40);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + ((double)u_local * 4.0) / 27.0;
  operator*(&local_a0,4.0);
  operator/(&local_90,27.0);
  operator*(&local_80,(double)u_local);
  operator+(local_70,y);
  Mat::Mat(&local_b0,u);
  (*pcVar1)(dVar2,local_70,this + 0x88,&local_b0);
  Mat::~Mat(&local_b0);
  Mat::~Mat(local_70);
  Mat::~Mat(&local_80);
  Mat::~Mat(&local_90);
  Mat::~Mat(&local_a0);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + ((double)u_local + (double)u_local) / 9.0;
  operator/(&local_f0,18.0);
  operator/(&local_100,6.0);
  operator+(&local_e0,&local_f0);
  operator*(&local_d0,(double)u_local);
  operator+(&local_c0,y);
  Mat::Mat(&local_110,u);
  (*pcVar1)(dVar2,&local_c0,this + 0x98,&local_110);
  Mat::~Mat(&local_110);
  Mat::~Mat(&local_c0);
  Mat::~Mat(&local_d0);
  Mat::~Mat(&local_e0);
  Mat::~Mat(&local_100);
  Mat::~Mat(&local_f0);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + (double)u_local / 3.0;
  operator/(&local_150,12.0);
  operator*(&local_160,0.25);
  operator+(&local_140,&local_150);
  operator*(&local_130,(double)u_local);
  operator+(&local_120,y);
  Mat::Mat(&local_170,u);
  (*pcVar1)(dVar2,&local_120,this + 0xa8,&local_170);
  Mat::~Mat(&local_170);
  Mat::~Mat(&local_120);
  Mat::~Mat(&local_130);
  Mat::~Mat(&local_140);
  Mat::~Mat(&local_160);
  Mat::~Mat(&local_150);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)u_local * 0.5 + (double)y_local;
  operator/(&local_1b0,8.0);
  operator*(&local_1d0,3.0);
  operator*(&local_1c0,0.125);
  operator+(&local_1a0,&local_1b0);
  operator*(&local_190,(double)u_local);
  operator+(&local_180,y);
  Mat::Mat(&local_1e0,u);
  (*pcVar1)(dVar2,&local_180,this + 0xb8,&local_1e0);
  Mat::~Mat(&local_1e0);
  Mat::~Mat(&local_180);
  Mat::~Mat(&local_190);
  Mat::~Mat(&local_1a0);
  Mat::~Mat(&local_1c0);
  Mat::~Mat(&local_1d0);
  Mat::~Mat(&local_1b0);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + ((double)u_local + (double)u_local) / 3.0;
  operator*(&local_250,13.0);
  operator*(&local_260,27.0);
  operator-(&local_240,&local_250);
  operator*(&local_270,42.0);
  operator+(&local_230,&local_240);
  operator*(&local_280,8.0);
  operator+(&local_220,&local_230);
  operator*(&local_210,(double)u_local);
  operator/(&local_200,54.0);
  operator+(&local_1f0,y);
  Mat::Mat(&local_290,u);
  (*pcVar1)(dVar2,&local_1f0,this + 200,&local_290);
  Mat::~Mat(&local_290);
  Mat::~Mat(&local_1f0);
  Mat::~Mat(&local_200);
  Mat::~Mat(&local_210);
  Mat::~Mat(&local_220);
  Mat::~Mat(&local_280);
  Mat::~Mat(&local_230);
  Mat::~Mat(&local_270);
  Mat::~Mat(&local_240);
  Mat::~Mat(&local_260);
  Mat::~Mat(&local_250);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + (double)u_local / 6.0;
  operator*(&local_310,389.0);
  operator*(&local_320,54.0);
  operator-(&local_300,&local_310);
  operator*(&local_330,966.0);
  operator+(&local_2f0,&local_300);
  operator*(&local_340,824.0);
  operator-(&local_2e0,&local_2f0);
  operator*(&local_350,243.0);
  operator+(&local_2d0,&local_2e0);
  operator*(&local_2c0,(double)u_local);
  operator/(&local_2b0,4320.0);
  operator+(&local_2a0,y);
  Mat::Mat(&local_360,u);
  (*pcVar1)(dVar2,&local_2a0,this + 0xd8,&local_360);
  Mat::~Mat(&local_360);
  Mat::~Mat(&local_2a0);
  Mat::~Mat(&local_2b0);
  Mat::~Mat(&local_2c0);
  Mat::~Mat(&local_2d0);
  Mat::~Mat(&local_350);
  Mat::~Mat(&local_2e0);
  Mat::~Mat(&local_340);
  Mat::~Mat(&local_2f0);
  Mat::~Mat(&local_330);
  Mat::~Mat(&local_300);
  Mat::~Mat(&local_320);
  Mat::~Mat(&local_310);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + (double)u_local;
  operator*(&local_3f0,-231.0);
  operator*(&local_400,81.0);
  operator+(&local_3e0,&local_3f0);
  operator*(&local_410,1164.0);
  operator-(&local_3d0,&local_3e0);
  operator*(&local_420,656.0);
  operator+(&local_3c0,&local_3d0);
  operator*(&local_430,122.0);
  operator-(&local_3b0,&local_3c0);
  operator*(&local_440,800.0);
  operator+(&local_3a0,&local_3b0);
  operator*(&local_390,(double)u_local);
  operator*(&local_380,0.05);
  operator+(&local_370,y);
  Mat::Mat(&local_450,u);
  (*pcVar1)(dVar2,&local_370,this + 0xe8,&local_450);
  Mat::~Mat(&local_450);
  Mat::~Mat(&local_370);
  Mat::~Mat(&local_380);
  Mat::~Mat(&local_390);
  Mat::~Mat(&local_3a0);
  Mat::~Mat(&local_440);
  Mat::~Mat(&local_3b0);
  Mat::~Mat(&local_430);
  Mat::~Mat(&local_3c0);
  Mat::~Mat(&local_420);
  Mat::~Mat(&local_3d0);
  Mat::~Mat(&local_410);
  Mat::~Mat(&local_3e0);
  Mat::~Mat(&local_400);
  Mat::~Mat(&local_3f0);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + ((double)u_local * 5.0) / 6.0;
  operator*(&local_4f0,-127.0);
  operator*(&local_500,18.0);
  operator+(&local_4e0,&local_4f0);
  operator*(&local_510,678.0);
  operator-(&local_4d0,&local_4e0);
  operator*(&local_520,456.0);
  operator+(&local_4c0,&local_4d0);
  operator*(&local_530,9.0);
  operator-(&local_4b0,&local_4c0);
  operator*(&local_540,576.0);
  operator+(&local_4a0,&local_4b0);
  operator*(&local_550,4.0);
  operator+(&local_490,&local_4a0);
  operator*(&local_480,(double)u_local);
  operator/(&local_470,288.0);
  operator+(&local_460,y);
  Mat::Mat(&local_560,u);
  (*pcVar1)(dVar2,&local_460,this + 0xf8,&local_560);
  Mat::~Mat(&local_560);
  Mat::~Mat(&local_460);
  Mat::~Mat(&local_470);
  Mat::~Mat(&local_480);
  Mat::~Mat(&local_490);
  Mat::~Mat(&local_550);
  Mat::~Mat(&local_4a0);
  Mat::~Mat(&local_540);
  Mat::~Mat(&local_4b0);
  Mat::~Mat(&local_530);
  Mat::~Mat(&local_4c0);
  Mat::~Mat(&local_520);
  Mat::~Mat(&local_4d0);
  Mat::~Mat(&local_510);
  Mat::~Mat(&local_4e0);
  Mat::~Mat(&local_500);
  Mat::~Mat(&local_4f0);
  pcVar1 = *(code **)(this + 0x30);
  dVar2 = (double)y_local + (double)u_local;
  operator*(&local_610,1481.0);
  operator*(&local_620,81.0);
  operator-(&local_600,&local_610);
  operator*(&local_630,7104.0);
  operator+(&local_5f0,&local_600);
  operator*(&local_640,3376.0);
  operator-(&local_5e0,&local_5f0);
  operator*(&local_650,72.0);
  operator+(&local_5d0,&local_5e0);
  operator*(&local_660,5040.0);
  operator-(&local_5c0,&local_5d0);
  operator*(&local_670,60.0);
  operator-(&local_5b0,&local_5c0);
  operator*(&local_680,720.0);
  operator+(&local_5a0,&local_5b0);
  operator*(&local_590,(double)u_local);
  operator/(&local_580,820.0);
  operator+(&local_570,y);
  Mat::Mat(&local_690,u);
  (*pcVar1)(dVar2,&local_570,this + 0x108,&local_690);
  Mat::~Mat(&local_690);
  Mat::~Mat(&local_570);
  Mat::~Mat(&local_580);
  Mat::~Mat(&local_590);
  Mat::~Mat(&local_5a0);
  Mat::~Mat(&local_680);
  Mat::~Mat(&local_5b0);
  Mat::~Mat(&local_670);
  Mat::~Mat(&local_5c0);
  Mat::~Mat(&local_660);
  Mat::~Mat(&local_5d0);
  Mat::~Mat(&local_650);
  Mat::~Mat(&local_5e0);
  Mat::~Mat(&local_640);
  Mat::~Mat(&local_5f0);
  Mat::~Mat(&local_630);
  Mat::~Mat(&local_600);
  Mat::~Mat(&local_620);
  Mat::~Mat(&local_610);
  operator*(&local_730,41.0);
  operator*(&local_740,27.0);
  operator+(&local_720,&local_730);
  operator*(&local_750,272.0);
  operator+(&local_710,&local_720);
  operator*(&local_760,27.0);
  operator+(&local_700,&local_710);
  operator*(&local_770,216.0);
  operator+(&local_6f0,&local_700);
  operator*(&local_780,216.0);
  operator+(&local_6e0,&local_6f0);
  operator*(&local_790,41.0);
  operator+(&local_6d0,&local_6e0);
  operator*(&local_6c0,(double)u_local / 840.0);
  operator+(&local_6b0,y);
  Mat::operator=(&local_6a0,y);
  Mat::~Mat(&local_6a0);
  Mat::~Mat(&local_6b0);
  Mat::~Mat(&local_6c0);
  Mat::~Mat(&local_6d0);
  Mat::~Mat(&local_790);
  Mat::~Mat(&local_6e0);
  Mat::~Mat(&local_780);
  Mat::~Mat(&local_6f0);
  Mat::~Mat(&local_770);
  Mat::~Mat(&local_700);
  Mat::~Mat(&local_760);
  Mat::~Mat(&local_710);
  Mat::~Mat(&local_750);
  Mat::~Mat(&local_720);
  Mat::~Mat(&local_740);
  Mat::~Mat(&local_730);
  *(int *)this = *(int *)this + 10;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  return;
}

Assistant:

void RK8::Step(double t, Mat y, double h, Mat u) {	
	f_(t           , y                                                                                                        , k_1_,   u);
	f_(t+h*4.0/27.0, y+(k_1_*4.0/27.0)*h                                                                                      , k_2_,   u);
	f_(t+h*2.0/9.0 , y+(k_1_/18.0   +k_2_/6.0)*h                                                                              , k_3_,   u);
	f_(t+h/3.0     , y+(k_1_/12.0   +k_3_*0.25)*h                                                                             , k_4_,   u);
	f_(t+h*0.5     , y+(k_1_/8.0    +k_4_*3.0*0.125)*h                                                                        , k_5_,   u);
	f_(t+h*2.0/3.0 , y+(k_1_*13.0   -k_3_*27.0 +k_4_*42.0  +k_5_*8.0)*h/54.0                                                  , k_6_,   u);
	f_(t+h*1.0/6.0 , y+(k_1_*389.0  -k_3_*54.0 +k_4_*966.0 -k_5_*824.0  +k_6_*243.0)*h/4320.0                                 , k_7_,   u);
	f_(t+h         , y+(k_1_*-231.0 +k_3_*81.0 -k_4_*1164.0+k_5_*656.0  -k_6_*122.0+k_7_*800.0)*h*0.05                        , k_8_,   u);
	f_(t+h*5.0/6.0 , y+(k_1_*-127.0 +k_3_*18.0 -k_4_*678.0 +k_5_*456.0  -k_6_*9.0  +k_7_*576.0 +k_8_*4.0)*h/288.0             , k_9_,   u);
	f_(t+h         , y+(k_1_*1481.0 -k_3_*81.0 +k_4_*7104.0-k_5_*3376.0 +k_6_*72.0 -k_7_*5040.0-k_8_*60.0+k_9_*720.0)*h/820.0 , k_10_,  u);
	y = y + (k_1_*41.0 + k_4_*27 + k_5_*272.0 + k_6_*27.0+k_7_*216.0+ k_9_*216.0+k_10_*41.0 )*(h/840.0);
	t = t + h; // Update independent variable
	n_fevals_ += 10;
	n_steps_ += 1;
 }